

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyorigin.h
# Opt level: O1

bool operator<(KeyOriginInfo *a,KeyOriginInfo *b)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  uint *puVar7;
  ulong uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  bool bVar10;
  
  uVar1 = *(uint *)a->fingerprint;
  uVar5 = *(uint *)b->fingerprint;
  uVar4 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar1 = (uint)(uVar4 < uVar5);
  uVar5 = (uint)(uVar4 >= uVar5 && uVar4 != uVar5);
  bVar10 = true;
  if ((int)(uVar5 - uVar1) < 0) goto LAB_003b43da;
  if (uVar5 == uVar1) {
    puVar6 = (a->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (a->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar8 = (long)puVar2 - (long)puVar6 >> 2;
    puVar7 = (b->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (b->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar9 = (long)puVar3 - (long)puVar7 >> 2;
    if (uVar8 < uVar9) goto LAB_003b43da;
    if (uVar8 <= uVar9) {
      for (; puVar6 != puVar2; puVar6 = puVar6 + 1) {
        if (puVar7 == puVar3) goto LAB_003b4386;
        bVar10 = *puVar6 < *puVar7;
        if (*puVar6 != *puVar7) goto LAB_003b43da;
        puVar7 = puVar7 + 1;
      }
      bVar10 = puVar7 != puVar3;
      goto LAB_003b43da;
    }
  }
LAB_003b4386:
  bVar10 = false;
LAB_003b43da:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return bVar10;
}

Assistant:

bool operator<(const KeyOriginInfo& a, const KeyOriginInfo& b)
    {
        // Compare the fingerprints lexicographically
        int fpr_cmp = memcmp(a.fingerprint, b.fingerprint, 4);
        if (fpr_cmp < 0) {
            return true;
        } else if (fpr_cmp > 0) {
            return false;
        }
        // Compare the sizes of the paths, shorter is "less than"
        if (a.path.size() < b.path.size()) {
            return true;
        } else if (a.path.size() > b.path.size()) {
            return false;
        }
        // Paths same length, compare them lexicographically
        return a.path < b.path;
    }